

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeKernelSetArgumentValue
          (ze_kernel_handle_t hKernel,uint32_t argIndex,size_t argSize,void *pArgValue)

{
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  _Node_iterator_base<std::pair<object_t<_ze_sampler_handle_t_*>_*const,__ze_sampler_handle_t_*>,_false>
  local_a0;
  _Node_iterator_base<std::pair<object_t<_ze_sampler_handle_t_*>_*const,__ze_sampler_handle_t_*>,_false>
  local_98;
  _Node_iterator_base<std::pair<object_t<_ze_image_handle_t_*>_*const,__ze_image_handle_t_*>,_false>
  local_90;
  _Node_iterator_base<std::pair<object_t<_ze_image_handle_t_*>_*const,__ze_image_handle_t_*>,_false>
  local_88 [3];
  lock_guard<std::mutex> local_70;
  lock_guard<std::mutex> sampler_lock;
  lock_guard<std::mutex> image_lock;
  ze_sampler_object_t **samplerHandle;
  ze_image_object_t **imageHandle;
  void *internalArgValue;
  ze_pfnKernelSetArgumentValue_t pfnSetArgumentValue;
  dditable_t *dditable;
  ze_result_t result;
  void *pArgValue_local;
  size_t argSize_local;
  uint32_t argIndex_local;
  ze_kernel_handle_t hKernel_local;
  
  pcVar1 = *(code **)(*(long *)(hKernel + 8) + 0x580);
  if (pcVar1 == (code *)0x0) {
    hKernel_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    uVar2 = *(undefined8 *)hKernel;
    imageHandle = (ze_image_object_t **)pArgValue;
    if (pArgValue != (void *)0x0) {
      std::lock_guard<std::mutex>::lock_guard(&sampler_lock,(mutex_type *)(context + 0x1500));
      std::lock_guard<std::mutex>::lock_guard(&local_70,(mutex_type *)(context + 0x1528));
      local_88[0]._M_cur =
           (__node_type *)
           std::
           unordered_map<object_t<_ze_image_handle_t_*>_*,__ze_image_handle_t_*,_std::hash<object_t<_ze_image_handle_t_*>_*>,_std::equal_to<object_t<_ze_image_handle_t_*>_*>,_std::allocator<std::pair<object_t<_ze_image_handle_t_*>_*const,__ze_image_handle_t_*>_>_>
           ::find((unordered_map<object_t<_ze_image_handle_t_*>_*,__ze_image_handle_t_*,_std::hash<object_t<_ze_image_handle_t_*>_*>,_std::equal_to<object_t<_ze_image_handle_t_*>_*>,_std::allocator<std::pair<object_t<_ze_image_handle_t_*>_*const,__ze_image_handle_t_*>_>_>
                   *)(context + 0x1550),(key_type *)pArgValue);
      local_90._M_cur =
           (__node_type *)
           std::
           unordered_map<object_t<_ze_image_handle_t_*>_*,__ze_image_handle_t_*,_std::hash<object_t<_ze_image_handle_t_*>_*>,_std::equal_to<object_t<_ze_image_handle_t_*>_*>,_std::allocator<std::pair<object_t<_ze_image_handle_t_*>_*const,__ze_image_handle_t_*>_>_>
           ::end((unordered_map<object_t<_ze_image_handle_t_*>_*,__ze_image_handle_t_*,_std::hash<object_t<_ze_image_handle_t_*>_*>,_std::equal_to<object_t<_ze_image_handle_t_*>_*>,_std::allocator<std::pair<object_t<_ze_image_handle_t_*>_*const,__ze_image_handle_t_*>_>_>
                  *)(context + 0x1550));
      bVar3 = std::__detail::operator!=(local_88,&local_90);
      if (bVar3) {
        imageHandle = (ze_image_object_t **)
                      std::
                      unordered_map<object_t<_ze_image_handle_t_*>_*,__ze_image_handle_t_*,_std::hash<object_t<_ze_image_handle_t_*>_*>,_std::equal_to<object_t<_ze_image_handle_t_*>_*>,_std::allocator<std::pair<object_t<_ze_image_handle_t_*>_*const,__ze_image_handle_t_*>_>_>
                      ::operator[]((unordered_map<object_t<_ze_image_handle_t_*>_*,__ze_image_handle_t_*,_std::hash<object_t<_ze_image_handle_t_*>_*>,_std::equal_to<object_t<_ze_image_handle_t_*>_*>,_std::allocator<std::pair<object_t<_ze_image_handle_t_*>_*const,__ze_image_handle_t_*>_>_>
                                    *)(context + 0x1550),(key_type *)pArgValue);
      }
      else {
        local_98._M_cur =
             (__node_type *)
             std::
             unordered_map<object_t<_ze_sampler_handle_t_*>_*,__ze_sampler_handle_t_*,_std::hash<object_t<_ze_sampler_handle_t_*>_*>,_std::equal_to<object_t<_ze_sampler_handle_t_*>_*>,_std::allocator<std::pair<object_t<_ze_sampler_handle_t_*>_*const,__ze_sampler_handle_t_*>_>_>
             ::find((unordered_map<object_t<_ze_sampler_handle_t_*>_*,__ze_sampler_handle_t_*,_std::hash<object_t<_ze_sampler_handle_t_*>_*>,_std::equal_to<object_t<_ze_sampler_handle_t_*>_*>,_std::allocator<std::pair<object_t<_ze_sampler_handle_t_*>_*const,__ze_sampler_handle_t_*>_>_>
                     *)(context + 0x1588),(key_type *)pArgValue);
        local_a0._M_cur =
             (__node_type *)
             std::
             unordered_map<object_t<_ze_sampler_handle_t_*>_*,__ze_sampler_handle_t_*,_std::hash<object_t<_ze_sampler_handle_t_*>_*>,_std::equal_to<object_t<_ze_sampler_handle_t_*>_*>,_std::allocator<std::pair<object_t<_ze_sampler_handle_t_*>_*const,__ze_sampler_handle_t_*>_>_>
             ::end((unordered_map<object_t<_ze_sampler_handle_t_*>_*,__ze_sampler_handle_t_*,_std::hash<object_t<_ze_sampler_handle_t_*>_*>,_std::equal_to<object_t<_ze_sampler_handle_t_*>_*>,_std::allocator<std::pair<object_t<_ze_sampler_handle_t_*>_*const,__ze_sampler_handle_t_*>_>_>
                    *)(context + 0x1588));
        bVar3 = std::__detail::operator!=(&local_98,&local_a0);
        if (bVar3) {
          imageHandle = (ze_image_object_t **)
                        std::
                        unordered_map<object_t<_ze_sampler_handle_t_*>_*,__ze_sampler_handle_t_*,_std::hash<object_t<_ze_sampler_handle_t_*>_*>,_std::equal_to<object_t<_ze_sampler_handle_t_*>_*>,_std::allocator<std::pair<object_t<_ze_sampler_handle_t_*>_*const,__ze_sampler_handle_t_*>_>_>
                        ::operator[]((unordered_map<object_t<_ze_sampler_handle_t_*>_*,__ze_sampler_handle_t_*,_std::hash<object_t<_ze_sampler_handle_t_*>_*>,_std::equal_to<object_t<_ze_sampler_handle_t_*>_*>,_std::allocator<std::pair<object_t<_ze_sampler_handle_t_*>_*const,__ze_sampler_handle_t_*>_>_>
                                      *)(context + 0x1588),(key_type *)pArgValue);
        }
      }
      std::lock_guard<std::mutex>::~lock_guard(&local_70);
      std::lock_guard<std::mutex>::~lock_guard(&sampler_lock);
    }
    hKernel_local._4_4_ = (*pcVar1)(uVar2,argIndex,argSize,imageHandle);
  }
  return hKernel_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeKernelSetArgumentValue(
        ze_kernel_handle_t hKernel,                     ///< [in] handle of the kernel object
        uint32_t argIndex,                              ///< [in] argument index in range [0, num args - 1]
        size_t argSize,                                 ///< [in] size of argument type
        const void* pArgValue                           ///< [in][optional] argument value represented as matching arg type. If
                                                        ///< null then argument value is considered null.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_kernel_object_t*>( hKernel )->dditable;
        auto pfnSetArgumentValue = dditable->ze.Kernel.pfnSetArgumentValue;
        if( nullptr == pfnSetArgumentValue )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hKernel = reinterpret_cast<ze_kernel_object_t*>( hKernel )->handle;

        // convert pArgValue to correct handle if applicable
        void *internalArgValue = const_cast<void *>(pArgValue);
        if (pArgValue) {
            // check if the arg value is a translated handle
            ze_image_object_t **imageHandle = static_cast<ze_image_object_t **>(internalArgValue);
            ze_sampler_object_t **samplerHandle = static_cast<ze_sampler_object_t **>(internalArgValue);
            {
                std::lock_guard<std::mutex> image_lock(context->image_handle_map_lock);
                std::lock_guard<std::mutex> sampler_lock(context->sampler_handle_map_lock);
                if( context->image_handle_map.find(*imageHandle) != context->image_handle_map.end() ) {
                    internalArgValue = &context->image_handle_map[*imageHandle];
                } else if( context->sampler_handle_map.find(*samplerHandle) != context->sampler_handle_map.end() ) {
                    internalArgValue = &context->sampler_handle_map[*samplerHandle];
                }
            }
        }
        // forward to device-driver
        result = pfnSetArgumentValue( hKernel, argIndex, argSize, const_cast<const void *>(internalArgValue) );

        return result;
    }